

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

void aom_hadamard_lp_8x8_c(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  int i;
  long lVar1;
  long lVar2;
  int16_t *coeff_00;
  int16_t *piVar3;
  int16_t buffer2 [64];
  int16_t buffer [64];
  int16_t local_128 [64];
  int16_t aiStack_a8 [68];
  
  coeff_00 = local_128;
  piVar3 = local_128;
  lVar2 = 0;
  do {
    hadamard_col8(src_diff,src_stride,(int16_t *)((long)aiStack_a8 + lVar2));
    src_diff = src_diff + 1;
    lVar2 = lVar2 + 0x10;
  } while ((int)lVar2 != 0x80);
  lVar2 = 0;
  do {
    hadamard_col8((int16_t *)((long)aiStack_a8 + lVar2),8,coeff_00);
    coeff_00 = coeff_00 + 8;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x10);
  memcpy(coeff,local_128,0x80);
  lVar2 = 0;
  do {
    lVar1 = 0;
    do {
      *(undefined2 *)((long)coeff + lVar1) = *(undefined2 *)((long)piVar3 + lVar1 * 8);
      lVar1 = lVar1 + 2;
    } while (lVar1 != 0x10);
    lVar2 = lVar2 + 1;
    coeff = coeff + 8;
    piVar3 = (int16_t *)((long)piVar3 + 2);
  } while (lVar2 != 8);
  return;
}

Assistant:

void aom_hadamard_lp_8x8_c(const int16_t *src_diff, ptrdiff_t src_stride,
                           int16_t *coeff) {
  int16_t buffer[64];
  int16_t buffer2[64];
  int16_t *tmp_buf = &buffer[0];
  for (int idx = 0; idx < 8; ++idx) {
    hadamard_col8(src_diff, src_stride, tmp_buf);  // src_diff: 9 bit
                                                   // dynamic range [-255, 255]
    tmp_buf += 8;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (int idx = 0; idx < 8; ++idx) {
    hadamard_col8(tmp_buf, 8, buffer2 + 8 * idx);  // tmp_buf: 12 bit
    // dynamic range [-2040, 2040]
    // buffer2: 15 bit
    // dynamic range [-16320, 16320]
    ++tmp_buf;
  }

  for (int idx = 0; idx < 64; ++idx) coeff[idx] = buffer2[idx];

  // Extra transpose to match SSE2 behavior(i.e., aom_hadamard_lp_8x8_sse2).
  for (int i = 0; i < 8; i++) {
    for (int j = 0; j < 8; j++) {
      coeff[i * 8 + j] = buffer2[j * 8 + i];
    }
  }
}